

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void asl::Process::makeDaemon(void)

{
  __pid_t _Var1;
  int _pid;
  
  _Var1 = fork();
  if ((_Var1 != -1) && (_Var1 != 0)) {
    _exit(0);
  }
  return;
}

Assistant:

void Process::makeDaemon()
{
	int _pid = fork();
	switch (_pid)
	{
	case -1: // error
		break;

	case 0: // child
        break;

	default: // parent
		_exit(0); // child inherited by init process
	}
}